

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3tokColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  Mem *pMem;
  i64 val;
  int n;
  sqlite3_vtab *z;
  
  switch(iCol) {
  case 0:
    z = pCursor[1].pVtab;
    n = -1;
    goto LAB_001c83fb;
  case 1:
    z = pCursor[4].pVtab;
    n = *(int *)&pCursor[5].pVtab;
LAB_001c83fb:
    setResultStrOrError(pCtx,(char *)z,n,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    return 0;
  case 2:
    val = (i64)*(int *)((long)&pCursor[5].pVtab + 4);
    break;
  case 3:
    val = (i64)*(int *)&pCursor[6].pVtab;
    break;
  default:
    val = (i64)*(int *)((long)&pCursor[6].pVtab + 4);
  }
  pMem = pCtx->pOut;
  if ((pMem->flags & 0x2400) == 0) {
    (pMem->u).i = val;
    pMem->flags = 4;
  }
  else {
    vdbeReleaseAndSetInt64(pMem,val);
  }
  return 0;
}

Assistant:

static int fts3tokColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts3tokCursor *pCsr = (Fts3tokCursor *)pCursor;

  /* CREATE TABLE x(input, token, start, end, position) */
  switch( iCol ){
    case 0:
      sqlite3_result_text(pCtx, pCsr->zInput, -1, SQLITE_TRANSIENT);
      break;
    case 1:
      sqlite3_result_text(pCtx, pCsr->zToken, pCsr->nToken, SQLITE_TRANSIENT);
      break;
    case 2:
      sqlite3_result_int(pCtx, pCsr->iStart);
      break;
    case 3:
      sqlite3_result_int(pCtx, pCsr->iEnd);
      break;
    default:
      assert( iCol==4 );
      sqlite3_result_int(pCtx, pCsr->iPos);
      break;
  }
  return SQLITE_OK;
}